

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O1

void __thiscall LinkInfo::parseDriveType(LinkInfo *this)

{
  ostream *poVar1;
  
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_UNKNOWN",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The drive type cannot be determined.",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DRIVE_NO_ROOT_DIR",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "The root path is invalid; for example, there is no volume mounted at the path.",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_REMOVABLE",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader."
               ,0x59);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_FIXED",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The drive has fixed media, such as a hard drive or flash drive.",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_REMOTE",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The drive is a remote (network) drive.",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_CDROM",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"The drive is a CD-ROM drive.",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((this->VolumeID).DriveType.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] == 6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DRIVE_RAMDISK",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar1 = (ostream *)std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                        Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"The drive is a RAM disk.",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void LinkInfo::parseDriveType() {
    if (VolumeID.DriveType[3] == DRIVE_UNKNOWN)
        cout << "DRIVE_UNKNOWN" << endl << Utils::defaultOffsetDocInfo <<
            "The drive type cannot be determined." << endl;
    if (VolumeID.DriveType[3] == DRIVE_NO_ROOT_DIR)
        cout << "DRIVE_NO_ROOT_DIR" << endl << Utils::defaultOffsetDocInfo <<
            "The root path is invalid; for example, there is no volume mounted at the path." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOVABLE)
        cout << "DRIVE_REMOVABLE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader." << endl;
    if (VolumeID.DriveType[3] == DRIVE_FIXED)
        cout << "DRIVE_FIXED" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has fixed media, such as a hard drive or flash drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOTE)
        cout << "DRIVE_REMOTE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a remote (network) drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_CDROM)
        cout << "DRIVE_CDROM" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a CD-ROM drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_RAMDISK)
        cout << "DRIVE_RAMDISK" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a RAM disk." << endl;
}